

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<std::__cxx11::string,int,bool,std::vector<int,std::allocator<int>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          bool *args_2,vector<int,_std::allocator<int>_> *args_3)

{
  QueueWriter *this_00;
  int iVar1;
  long lVar2;
  size_t sVar3;
  int *__dest;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t sizes [6];
  long local_68 [7];
  
  local_68[0] = 8;
  local_68[1] = 8;
  local_68[2] = args->_M_string_length + 4;
  local_68[3] = 4;
  local_68[4] = 1;
  local_68[5] = (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                (4 - (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  lVar6 = 0;
  lVar7 = 0;
  lVar2 = 0;
  do {
    lVar6 = lVar6 + local_68[lVar2];
    lVar7 = lVar7 + local_68[lVar2 + 1];
    lVar2 = lVar2 + 2;
  } while (lVar2 != 6);
  uVar5 = lVar7 + lVar6 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar5) &&
       (sVar3 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar3 < uVar5)) &&
      (replaceChannel(this,uVar5),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar5)) &&
     (sVar3 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar3 < uVar5)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar7 + lVar6);
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(uint64_t *)(pcVar4 + 4) = eventSourceId;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(uint64_t *)(pcVar4 + 8) = clock;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  uVar5 = args->_M_string_length;
  iVar1 = (int)uVar5;
  *(int *)(pcVar4 + 8) = iVar1;
  __dest = (int *)((this->_qw)._writePos + 4);
  (this->_qw)._writePos = (char *)__dest;
  if (iVar1 != 0) {
    uVar5 = uVar5 & 0xffffffff;
    memcpy(__dest,(args->_M_dataplus)._M_p,uVar5);
    __dest = (int *)((this->_qw)._writePos + uVar5);
    (this->_qw)._writePos = (char *)__dest;
  }
  *__dest = *args_1;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  pcVar4[4] = *args_2;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 1;
  uVar5 = (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar1 = (int)(uVar5 >> 2);
  *(int *)(pcVar4 + 1) = iVar1;
  pcVar4 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar4;
  if (iVar1 != 0) {
    uVar5 = uVar5 & 0x3fffffffc;
    memcpy(pcVar4,(args_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar5);
    pcVar4 = (this->_qw)._writePos + uVar5;
    (this->_qw)._writePos = pcVar4;
  }
  (this_00->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)pcVar4 - (long)this_00->_queue->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}